

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGen::Quoted_abi_cxx11_(string *__return_storage_ptr__,cmQtAutoGen *this,string_view text)

{
  long lVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string res;
  string local_100;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  char *local_98;
  char local_90 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,text._M_len,this + text._M_len,text._M_str);
  lVar1 = 8;
  do {
    cmsys::SystemTools::ReplaceString
              (&local_100,
               *(char **)(std::istream-in-cmBasicUVIStream<char,std::char_traits<char>>::
                          construction_vtable + lVar1 + 0x48),
               *(char **)((long)&Quoted[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)
                                 ::replacements + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x98);
  local_98 = local_90;
  local_a8 = 0;
  local_a0 = 1;
  local_90[0] = '\"';
  local_70.first._M_len = 1;
  local_70.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = local_100._M_string_length;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_100._M_dataplus._M_p;
  local_48 = 0;
  local_d0 = local_c8;
  local_e0 = 0;
  local_d8 = 1;
  local_c8[0] = 0x22;
  local_40 = 1;
  local_30 = 0;
  views._M_len = 3;
  views._M_array = &local_70;
  local_70.first._M_str = local_98;
  local_38 = local_d0;
  cmCatViews(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Quoted(cm::string_view text)
{
  static std::initializer_list<std::pair<const char*, const char*>> const
    replacements = { { "\\", "\\\\" }, { "\"", "\\\"" }, { "\a", "\\a" },
                     { "\b", "\\b" },  { "\f", "\\f" },  { "\n", "\\n" },
                     { "\r", "\\r" },  { "\t", "\\t" },  { "\v", "\\v" } };

  std::string res(text);
  for (auto const& pair : replacements) {
    cmSystemTools::ReplaceString(res, pair.first, pair.second);
  }
  return cmStrCat('"', res, '"');
}